

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  curl_slist **ppcVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  curl_slist **local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  CURLcode local_70;
  CURLINFO local_6c;
  CURLcode result;
  int type;
  curl_socket_t *param_socketp;
  curl_slist **param_slistp;
  char **param_charp;
  curl_off_t *param_offt;
  double *param_doublep;
  long *param_longp;
  va_list arg;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  ppcVar1 = local_118;
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_70 = CURLE_UNKNOWN_OPTION;
  if (data == (Curl_easy *)0x0) {
    data_local._4_4_ = CURLE_UNKNOWN_OPTION;
  }
  else {
    arg[0].overflow_arg_area = local_128;
    arg[0]._0_8_ = &stack0x00000008;
    local_6c = info & 0xf00000;
    local_110 = in_RCX;
    local_108 = in_R8;
    local_100 = in_R9;
    arg[0].reg_save_area._4_4_ = info;
    if (local_6c == 0x100000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_doublep = (double *)0x0;
      param_offt = (curl_off_t *)0x0;
      param_charp = (char **)0x0;
      param_socketp = (curl_socket_t *)0x0;
      _result = 0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_char(data,info,(char **)ppcVar1);
      }
    }
    else if (local_6c == 0x200000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_offt = (curl_off_t *)0x0;
      param_charp = (char **)0x0;
      param_slistp = (curl_slist **)0x0;
      param_socketp = (curl_socket_t *)0x0;
      _result = 0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_long(data,info,(long *)ppcVar1);
      }
    }
    else if (local_6c == 0x300000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_doublep = (double *)0x0;
      param_charp = (char **)0x0;
      param_slistp = (curl_slist **)0x0;
      param_socketp = (curl_socket_t *)0x0;
      _result = 0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_double(data,info,(double *)ppcVar1);
      }
    }
    else if (local_6c == 0x400000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_doublep = (double *)0x0;
      param_offt = (curl_off_t *)0x0;
      param_charp = (char **)0x0;
      param_slistp = (curl_slist **)0x0;
      _result = 0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_slist(data,info,ppcVar1);
      }
    }
    else if (local_6c == 0x500000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_doublep = (double *)0x0;
      param_offt = (curl_off_t *)0x0;
      param_charp = (char **)0x0;
      param_slistp = (curl_slist **)0x0;
      param_socketp = (curl_socket_t *)0x0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_socket(data,info,(curl_socket_t *)ppcVar1);
      }
    }
    else if (local_6c == 0x600000) {
      param_longp._4_4_ = 0x30;
      param_longp._0_4_ = 0x18;
      param_doublep = (double *)0x0;
      param_offt = (curl_off_t *)0x0;
      param_slistp = (curl_slist **)0x0;
      param_socketp = (curl_socket_t *)0x0;
      _result = 0;
      local_70 = CURLE_UNKNOWN_OPTION;
      if (local_118 != (curl_slist **)0x0) {
        local_118 = (curl_slist **)in_RDX;
        local_70 = getinfo_offt(data,info,(curl_off_t *)ppcVar1);
      }
    }
    data_local._4_4_ = local_70;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}